

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DJB.cpp
# Opt level: O0

uint32_t llvm::caseFoldingDjbHash(StringRef Buffer,uint32_t H)

{
  bool bVar1;
  UTF32 UVar2;
  uint *puVar3;
  uint32_t in_ECX;
  StringRef Buffer_00;
  ArrayRef<unsigned_char> local_68;
  undefined1 local_58 [8];
  StringRef Folded;
  UTF32 C;
  array<unsigned_char,_4UL> Storage;
  OptionalStorage<unsigned_int,_true> local_2c;
  Optional<unsigned_int> Result;
  uint32_t H_local;
  StringRef Buffer_local;
  
  register0x00000038 = Buffer.Data;
  Result.Storage.field_0 = (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)H;
  local_2c = (OptionalStorage<unsigned_int,_true>)fastCaseFoldingDjbHash(Buffer,H);
  bVar1 = Optional::operator_cast_to_bool((Optional *)&local_2c);
  if (bVar1) {
    puVar3 = Optional<unsigned_int>::operator*((Optional<unsigned_int> *)&local_2c);
    Buffer_local.Length._4_4_ = *puVar3;
  }
  else {
    while (bVar1 = StringRef::empty((StringRef *)&Result.Storage.hasVal), ((bVar1 ^ 0xffU) & 1) != 0
          ) {
      UVar2 = chopOneUTF32((StringRef *)&Result.Storage.hasVal);
      UVar2 = foldCharDwarf(UVar2);
      Folded.Length._0_4_ = UVar2;
      MutableArrayRef<unsigned_char>::MutableArrayRef<4ul>
                ((MutableArrayRef<unsigned_char> *)&local_68,
                 (array<unsigned_char,_4UL> *)((long)&Folded.Length + 4));
      _local_58 = toUTF8(UVar2,(MutableArrayRef<unsigned_char>)local_68);
      Buffer_00.Length._0_4_ = Result.Storage.field_0.value;
      Buffer_00.Data = Folded.Data;
      Buffer_00.Length._4_4_ = 0;
      Result.Storage.field_0.value = djbHash((llvm *)local_58,Buffer_00,in_ECX);
    }
    Buffer_local.Length._4_4_ = Result.Storage.field_0;
  }
  return Buffer_local.Length._4_4_;
}

Assistant:

uint32_t llvm::caseFoldingDjbHash(StringRef Buffer, uint32_t H) {
  if (Optional<uint32_t> Result = fastCaseFoldingDjbHash(Buffer, H))
    return *Result;

  std::array<UTF8, UNI_MAX_UTF8_BYTES_PER_CODE_POINT> Storage;
  while (!Buffer.empty()) {
    UTF32 C = foldCharDwarf(chopOneUTF32(Buffer));
    StringRef Folded = toUTF8(C, Storage);
    H = djbHash(Folded, H);
  }
  return H;
}